

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_advection_diffusion_reaction_splitting.c
# Opt level: O0

int jac_diffusion(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,void *user_data,N_Vector tmp1,
                 N_Vector tmp2,N_Vector tmp3)

{
  double dVar1;
  int i;
  sunrealtype coeff;
  UserData *udata;
  N_Vector tmp2_local;
  N_Vector tmp1_local;
  void *user_data_local;
  SUNMatrix Jac_local;
  N_Vector fy_local;
  N_Vector y_local;
  sunrealtype t_local;
  
  dVar1 = *(double *)((long)user_data + 0x18) /
          (*(double *)((long)user_data + 8) * *(double *)((long)user_data + 8));
  *(double *)(**(long **)((long)Jac->content + 0x40) + *(long *)((long)Jac->content + 0x28) * 8) =
       dVar1 * -2.0;
  for (i = 1; (long)i < *user_data; i = i + 1) {
    *(double *)
     (*(long *)(*(long *)((long)Jac->content + 0x40) + (long)i * 8) +
     (*(long *)((long)Jac->content + 0x28) + -1) * 8) = dVar1;
    *(double *)
     (*(long *)(*(long *)((long)Jac->content + 0x40) + (long)i * 8) +
     *(long *)((long)Jac->content + 0x28) * 8) = dVar1 * -2.0;
    *(double *)
     (*(long *)(*(long *)((long)Jac->content + 0x40) + (long)(i + -1) * 8) +
     (*(long *)((long)Jac->content + 0x28) + 1) * 8) = dVar1;
  }
  return 0;
}

Assistant:

static int jac_diffusion(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix Jac,
                         void* user_data, N_Vector tmp1, N_Vector tmp2,
                         N_Vector tmp3)
{
  UserData* udata   = (UserData*)user_data;
  sunrealtype coeff = udata->b / (udata->dx * udata->dx);

  SM_ELEMENT_B(Jac, 0, 0) = -2 * coeff;
  for (int i = 1; i < udata->N; i++)
  {
    SM_ELEMENT_B(Jac, i - 1, i) = coeff;
    SM_ELEMENT_B(Jac, i, i)     = -2 * coeff;
    SM_ELEMENT_B(Jac, i, i - 1) = coeff;
  }

  return 0;
}